

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O0

void __thiscall
Lib::
Recycled<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
::~Recycled(Recycled<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
            *this)

{
  bool bVar1;
  Stack<std::unique_ptr<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>_>
  *elem;
  long in_RDI;
  DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *in_stack_ffffffffffffffa8;
  DefaultReset *in_stack_ffffffffffffffb0;
  Stack<std::unique_ptr<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>_>
  *in_stack_ffffffffffffffc0;
  unique_ptr<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  local_10 [2];
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                      *)0x960b48);
  if (bVar1) {
    self((Recycled<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          *)0x960b67);
    bVar1 = DefaultKeepRecycled::operator()
                      ((DefaultKeepRecycled *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if ((bVar1) &&
       ((Recycled<Lib::DHSet<Kernel::TermSpec,Lib::DefaultHash,Lib::DefaultHash2>,Lib::DefaultReset,Lib::DefaultKeepRecycled>
         ::memAlive & 1) != 0)) {
      in_stack_ffffffffffffffc0 =
           (Stack<std::unique_ptr<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>_>
            *)(in_RDI + 8);
      self((Recycled<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
            *)0x960bac);
      DefaultReset::operator()(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      elem = mem();
      std::
      unique_ptr<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
      ::unique_ptr(local_10,(unique_ptr<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                             *)in_stack_ffffffffffffffa8);
      Stack<std::unique_ptr<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>_>
      ::push(in_stack_ffffffffffffffc0,
             (unique_ptr<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
              *)elem);
      std::
      unique_ptr<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
      ::~unique_ptr((unique_ptr<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                     *)in_stack_ffffffffffffffc0);
    }
  }
  std::
  unique_ptr<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  ::~unique_ptr((unique_ptr<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                 *)in_stack_ffffffffffffffc0);
  return;
}

Assistant:

~Recycled()
  {
    if (IF_USE_PTRS(_self, true) && _keep(self()) && memAlive) {
      _reset(self());
      mem().push(std::move(_self));
    }
  }